

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

ValueType ValueType::GetObject(ObjectType objectType)

{
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_12;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_10;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_e;
  ObjectType local_c;
  ValueType valueType;
  ObjectType objectType_local;
  
  local_e = UninitializedObject.field_0;
  local_c = objectType;
  SetObjectType((ValueType *)&local_e.field_0,objectType);
  if ((local_c == Array) || (local_c == ObjectWithArray)) {
    local_12.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         SetHasNoMissingValues((ValueType *)&local_e.field_0,false);
    local_10.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         SetArrayTypeId((ValueType *)&local_12.field_0,TypeIds_Array);
    local_e.field_0 = local_10.field_0;
  }
  aVar1.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       Verify(local_e.field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar1.field_0;
}

Assistant:

ValueType ValueType::GetObject(const ObjectType objectType)
{
    ValueType valueType(UninitializedObject);
    valueType.SetObjectType(objectType);
    if(objectType == ObjectType::Array || objectType == ObjectType::ObjectWithArray)
    {
        // Default to the most conservative array-specific information. This just a safeguard to guarantee that the returned
        // value type has a valid set of array-specific information. Callers should not rely on these defaults, and should
        // instead always set each piece of information explicitly.
        valueType = valueType.SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array);
    }
    return Verify(valueType);
}